

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionJITTimeInfo.cpp
# Opt level: O1

void FunctionJITTimeInfo::BuildJITTimeData
               (ArenaAllocator *alloc,FunctionCodeGenJitTimeData *codeGenData,
               FunctionCodeGenRuntimeData *runtimeData,FunctionJITTimeDataIDL *jitData,
               bool isInlinee,bool isForegroundJIT)

{
  ushort uVar1;
  uint uVar2;
  WriteBarrierPtr<ObjTypeSpecFldInfo> *pWVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  BOOL BVar7;
  FunctionInfo *pFVar8;
  FunctionBody *pFVar9;
  ByteBlock *pBVar10;
  undefined4 *puVar11;
  FunctionBodyDataIDL *pFVar12;
  ProfileDataIDL *data;
  DynamicProfileInfo *profileInfo;
  ProxyEntryPointInfo *pPVar13;
  FunctionJITTimeDataIDL **ppFVar14;
  boolean *__s;
  FunctionCodeGenJitTimeData *pFVar15;
  FunctionCodeGenRuntimeData *pFVar16;
  FunctionJITTimeDataIDL *pFVar17;
  FunctionJITRuntimeIDL *pFVar18;
  InlineCachePointerArray<Js::InlineCache> *pIVar19;
  long *plVar20;
  InlineCache *pIVar21;
  ProfileId PVar22;
  ulong uVar23;
  InlineCacheIndex inlineCacheIndex;
  size_t sVar24;
  FunctionCodeGenRuntimeData *local_50;
  
  while( true ) {
    pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(codeGenData);
    jitData->functionInfoAddr = (long)pFVar8;
    pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(codeGenData);
    jitData->localFuncId = pFVar8->functionId;
    jitData->isAggressiveInliningEnabled = codeGenData->isAggressiveInliningEnabled;
    jitData->isInlined = codeGenData->isInlined;
    jitData->weakFuncRef = (long)(codeGenData->weakFuncRef).ptr;
    jitData->inlineesBv = (BVFixedIDL *)(codeGenData->inlineesBv).ptr;
    jitData->entryPointInfoAddr = (long)(codeGenData->entryPointInfo).ptr;
    pFVar9 = Js::FunctionCodeGenJitTimeData::GetFunctionBody(codeGenData);
    if (pFVar9 == (FunctionBody *)0x0) break;
    pFVar9 = Js::FunctionCodeGenJitTimeData::GetFunctionBody(codeGenData);
    pBVar10 = Js::FunctionBody::GetByteCode(pFVar9);
    if (pBVar10 == (ByteBlock *)0x0) break;
    pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(codeGenData);
    pFVar9 = (FunctionBody *)Js::FunctionInfo::GetParseableFunctionInfo(pFVar8);
    bVar5 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar9);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar5) goto LAB_0043c144;
      *puVar11 = 0;
    }
    pFVar12 = (FunctionBodyDataIDL *)new<Memory::ArenaAllocator>(0x1b8,alloc,0x36904a);
    jitData->bodyData = pFVar12;
    JITTimeFunctionBody::InitializeJITFunctionData(alloc,pFVar9,pFVar12);
    if ((runtimeData != (FunctionCodeGenRuntimeData *)0x0) != (bool)(isInlinee & 1U)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                         ,0x2b,"(isInlinee == !!runtimeData)","isInlinee == !!runtimeData");
      if (!bVar5) goto LAB_0043c144;
      *puVar11 = 0;
    }
    if (runtimeData == (FunctionCodeGenRuntimeData *)0x0) {
      local_50 = (FunctionCodeGenRuntimeData *)0x0;
    }
    else {
      pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(codeGenData);
      pFVar9 = Js::FunctionInfo::GetFunctionBody(pFVar8);
      local_50 = Js::FunctionCodeGenRuntimeData::GetForTarget(runtimeData,pFVar9);
    }
    pFVar9 = Js::FunctionCodeGenJitTimeData::GetFunctionBody(codeGenData);
    if ((pFVar9->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
      data = (ProfileDataIDL *)new<Memory::ArenaAllocator>(0xb0,alloc,0x366bee);
      profileInfo = Js::FunctionBody::GetAnyDynamicProfileInfo(pFVar9);
      JITTimeProfileInfo::InitializeJITProfileData(alloc,profileInfo,pFVar9,data,isForegroundJIT);
      jitData->bodyData->profileData = data;
      if ((isInlinee & 1U) != 0) {
        pPVar13 = Js::FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)pFVar9);
        iVar6 = (*(pPVar13->super_ExpirableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[8])(pPVar13);
        if ((char)iVar6 == '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                             ,0x3f,"(defaultEntryPointInfo->IsFunctionEntryPointInfo())",
                             "defaultEntryPointInfo->IsFunctionEntryPointInfo()");
          if (!bVar5) goto LAB_0043c144;
          *puVar11 = 0;
        }
        jitData->callsCountAddress =
             (long)((long)&pPVar13[5].super_ExpirableObject.super_FinalizableObject.
                           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4);
        jitData->sharedPropertyGuards = (codeGenData->sharedPropertyGuards).ptr;
        jitData->sharedPropGuardCount = codeGenData->sharedPropertyGuardCount;
      }
    }
    uVar1 = jitData->bodyData->profiledCallSiteCount;
    if (uVar1 != 0) {
      jitData->inlineeCount = (uint)uVar1;
      BVar7 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar7 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar5) goto LAB_0043c144;
        *puVar11 = 0;
      }
      uVar23 = (ulong)uVar1;
      sVar24 = uVar23 * 8;
      ppFVar14 = (FunctionJITTimeDataIDL **)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal(&alloc->
                                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               ,sVar24);
      memset(ppFVar14,0,sVar24);
      memset(ppFVar14 + uVar23,0,(ulong)((int)sVar24 + 0xfU & 0xfffffff0) + uVar23 * -8);
      if (ppFVar14 == (FunctionJITTimeDataIDL **)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar5) goto LAB_0043c144;
        *puVar11 = 0;
      }
      jitData->inlinees = ppFVar14;
      uVar1 = jitData->bodyData->profiledCallSiteCount;
      uVar23 = (ulong)uVar1;
      if (uVar23 == 0) {
        __s = &DAT_00000008;
      }
      else {
        BVar7 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar7 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar5) goto LAB_0043c144;
          *puVar11 = 0;
        }
        __s = (boolean *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              AllocInternal(&alloc->
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                            ,uVar23);
        memset(__s,0,uVar23);
        memset(__s + uVar23,0,(uVar1 + 0xf & 0xfffffff0) - uVar23);
        if (__s == (boolean *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar5) goto LAB_0043c144;
          *puVar11 = 0;
        }
      }
      jitData->inlineesRecursionFlags = __s;
      uVar1 = jitData->bodyData->profiledCallSiteCount;
      if (uVar1 != 0) {
        uVar23 = 0;
        do {
          PVar22 = (ProfileId)uVar23;
          pFVar15 = Js::FunctionCodeGenJitTimeData::GetInlinee(codeGenData,PVar22);
          if (pFVar15 == codeGenData) {
            jitData->inlineesRecursionFlags[uVar23] = '\x01';
          }
          else if (pFVar15 != (FunctionCodeGenJitTimeData *)0x0) {
            pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(pFVar15);
            if ((pFVar8->functionBodyImpl).ptr == (FunctionProxy *)0x0) {
              pFVar16 = (FunctionCodeGenRuntimeData *)0x0;
            }
            else if ((isInlinee & 1U) == 0) {
              pFVar16 = Js::FunctionBody::GetInlineeCodeGenRuntimeData(pFVar9,PVar22);
            }
            else {
              pFVar16 = Js::FunctionCodeGenRuntimeData::GetInlinee(local_50,PVar22);
            }
            pFVar17 = (FunctionJITTimeDataIDL *)new<Memory::ArenaAllocator>(0xa8,alloc,0x36904a);
            jitData->inlinees[uVar23] = pFVar17;
            BuildJITTimeData(alloc,pFVar15,pFVar16,jitData->inlinees[uVar23],true,isForegroundJIT);
          }
          uVar23 = uVar23 + 1;
          uVar1 = jitData->bodyData->profiledCallSiteCount;
        } while (uVar23 < uVar1);
      }
      if (uVar1 == 0) {
        ppFVar14 = (FunctionJITTimeDataIDL **)&DAT_00000008;
      }
      else {
        BVar7 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar7 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar5) goto LAB_0043c144;
          *puVar11 = 0;
        }
        uVar23 = (ulong)((uint)uVar1 * 8);
        ppFVar14 = (FunctionJITTimeDataIDL **)
                   Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   AllocInternal(&alloc->
                                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 ,uVar23);
        memset(ppFVar14,0,uVar23);
        memset((char *)((long)ppFVar14 + uVar23),0,((uint)uVar1 * 8 + 0xf & 0xfffffff0) - uVar23);
        if (ppFVar14 == (FunctionJITTimeDataIDL **)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar5) goto LAB_0043c144;
          *puVar11 = 0;
        }
      }
      jitData->callbackInlinees = ppFVar14;
      pFVar12 = jitData->bodyData;
      if (pFVar12->profiledCallSiteCount != 0) {
        uVar23 = 0;
        do {
          PVar22 = (ProfileId)uVar23;
          pFVar15 = Js::FunctionCodeGenJitTimeData::GetCallbackInlinee(codeGenData,PVar22);
          if (pFVar15 != (FunctionCodeGenJitTimeData *)0x0) {
            pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(pFVar15);
            if ((pFVar8->functionBodyImpl).ptr == (FunctionProxy *)0x0) {
              pFVar16 = (FunctionCodeGenRuntimeData *)0x0;
            }
            else if ((isInlinee & 1U) == 0) {
              pFVar16 = Js::FunctionBody::GetCallbackInlineeCodeGenRuntimeData(pFVar9,PVar22);
            }
            else {
              pFVar16 = Js::FunctionCodeGenRuntimeData::GetCallbackInlinee(local_50,PVar22);
            }
            pFVar17 = (FunctionJITTimeDataIDL *)new<Memory::ArenaAllocator>(0xa8,alloc,0x36904a);
            jitData->callbackInlinees[uVar23] = pFVar17;
            BuildJITTimeData(alloc,pFVar15,pFVar16,jitData->callbackInlinees[uVar23],true,
                             isForegroundJIT);
          }
          uVar23 = uVar23 + 1;
          pFVar12 = jitData->bodyData;
        } while (uVar23 < pFVar12->profiledCallSiteCount);
      }
      uVar1 = pFVar12->profiledCallApplyCallSiteCount;
      jitData->callApplyTargetInlineeCount = (uint)uVar1;
      if (uVar1 != 0) {
        BVar7 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar7 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar5) goto LAB_0043c144;
          *puVar11 = 0;
        }
        uVar23 = (ulong)uVar1;
        sVar24 = uVar23 * 8;
        ppFVar14 = (FunctionJITTimeDataIDL **)
                   Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   AllocInternal(&alloc->
                                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 ,sVar24);
        memset(ppFVar14,0,sVar24);
        memset(ppFVar14 + uVar23,0,(ulong)((int)sVar24 + 0xfU & 0xfffffff0) + uVar23 * -8);
        if (ppFVar14 == (FunctionJITTimeDataIDL **)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar5) goto LAB_0043c144;
          *puVar11 = 0;
        }
        jitData->callApplyTargetInlinees = ppFVar14;
      }
      if (jitData->bodyData->profiledCallApplyCallSiteCount != 0) {
        uVar23 = 0;
        do {
          PVar22 = (ProfileId)uVar23;
          pFVar15 = Js::FunctionCodeGenJitTimeData::GetCallApplyTargetInlinee(codeGenData,PVar22);
          if (pFVar15 != (FunctionCodeGenJitTimeData *)0x0) {
            pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(pFVar15);
            if ((pFVar8->functionBodyImpl).ptr == (FunctionProxy *)0x0) {
              pFVar16 = (FunctionCodeGenRuntimeData *)0x0;
            }
            else if ((isInlinee & 1U) == 0) {
              pFVar16 = Js::FunctionBody::GetCallApplyTargetInlineeCodeGenRuntimeData(pFVar9,PVar22)
              ;
            }
            else {
              pFVar16 = Js::FunctionCodeGenRuntimeData::GetCallApplyTargetInlinee(local_50,PVar22);
            }
            pFVar17 = (FunctionJITTimeDataIDL *)new<Memory::ArenaAllocator>(0xa8,alloc,0x36904a);
            jitData->callApplyTargetInlinees[uVar23] = pFVar17;
            BuildJITTimeData(alloc,pFVar15,pFVar16,jitData->callApplyTargetInlinees[uVar23],true,
                             isForegroundJIT);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 < jitData->bodyData->profiledCallApplyCallSiteCount);
      }
    }
    pFVar18 = (FunctionJITRuntimeIDL *)new<Memory::ArenaAllocator>(0x10,alloc,0x36904a);
    jitData->profiledRuntimeData = pFVar18;
    if (((isInlinee & 1U) != 0) &&
       (pIVar19 = Js::FunctionCodeGenRuntimeData::ClonedInlineCaches(local_50),
       (pIVar19->inlineCaches).ptr != (WriteBarrierPtr<Js::InlineCache> *)0x0)) {
      uVar2 = jitData->bodyData->inlineCacheCount;
      jitData->profiledRuntimeData->clonedCacheCount = uVar2;
      if ((ulong)uVar2 == 0) {
        plVar20 = (long *)&DAT_00000008;
      }
      else {
        BVar7 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar7 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar5) goto LAB_0043c144;
          *puVar11 = 0;
        }
        plVar20 = (long *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                          ::AllocInternal(&alloc->
                                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                          ,(ulong)uVar2 << 3);
        if (plVar20 == (long *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar5) goto LAB_0043c144;
          *puVar11 = 0;
        }
      }
      jitData->profiledRuntimeData->clonedInlineCaches = plVar20;
      if (jitData->bodyData->inlineCacheCount != 0) {
        uVar23 = 0;
        do {
          pIVar19 = Js::FunctionCodeGenRuntimeData::ClonedInlineCaches(local_50);
          pIVar21 = Js::InlineCachePointerArray<Js::InlineCache>::GetInlineCache
                              (pIVar19,(uint)uVar23);
          jitData->profiledRuntimeData->clonedInlineCaches[uVar23] = (long)pIVar21;
          uVar23 = uVar23 + 1;
        } while (uVar23 < jitData->bodyData->inlineCacheCount);
      }
    }
    uVar2 = jitData->bodyData->inlineCacheCount;
    uVar23 = (ulong)uVar2;
    if (uVar23 != 0) {
      jitData->ldFldInlineeCount = uVar2;
      BVar7 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar7 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar5) goto LAB_0043c144;
        *puVar11 = 0;
      }
      sVar24 = uVar23 * 8;
      ppFVar14 = (FunctionJITTimeDataIDL **)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal(&alloc->
                                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               ,sVar24);
      memset(ppFVar14,0,sVar24);
      memset(ppFVar14 + uVar23,0,(sVar24 + 0xf & 0xfffffffffffffff0) + uVar23 * -8);
      if (ppFVar14 == (FunctionJITTimeDataIDL **)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar5) goto LAB_0043c144;
        *puVar11 = 0;
      }
      jitData->ldFldInlinees = ppFVar14;
      pWVar3 = (codeGenData->objTypeSpecFldInfoArray).infoArray.ptr;
      if (pWVar3 != (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) {
        jitData->objTypeSpecFldInfoCount = jitData->bodyData->inlineCacheCount;
        jitData->objTypeSpecFldInfoArray = (ObjTypeSpecFldIDL **)pWVar3;
      }
      if (jitData->bodyData->inlineCacheCount != 0) {
        uVar23 = 0;
        do {
          inlineCacheIndex = (InlineCacheIndex)uVar23;
          pFVar15 = Js::FunctionCodeGenJitTimeData::GetLdFldInlinee(codeGenData,inlineCacheIndex);
          if ((isInlinee & 1U) == 0) {
            pFVar16 = Js::FunctionBody::GetLdFldInlineeCodeGenRuntimeData(pFVar9,inlineCacheIndex);
          }
          else {
            pFVar16 = Js::FunctionCodeGenRuntimeData::GetLdFldInlinee(local_50,inlineCacheIndex);
          }
          if (pFVar15 != (FunctionCodeGenJitTimeData *)0x0) {
            pFVar17 = (FunctionJITTimeDataIDL *)new<Memory::ArenaAllocator>(0xa8,alloc,0x36904a);
            jitData->ldFldInlinees[uVar23] = pFVar17;
            BuildJITTimeData(alloc,pFVar15,pFVar16,jitData->ldFldInlinees[uVar23],true,
                             isForegroundJIT);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 < jitData->bodyData->inlineCacheCount);
      }
    }
    if (((isInlinee & 1U) == 0) && (codeGenData->globalObjTypeSpecFldInfoCount != 0)) {
      pWVar3 = (codeGenData->globalObjTypeSpecFldInfoArray).ptr;
      if (pWVar3 == (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                           ,0xa9,"(globObjTypeSpecInfo != nullptr)","globObjTypeSpecInfo != nullptr"
                          );
        if (!bVar5) goto LAB_0043c144;
        *puVar11 = 0;
      }
      jitData->globalObjTypeSpecFldInfoCount = codeGenData->globalObjTypeSpecFldInfoCount;
      jitData->globalObjTypeSpecFldInfoArray = (ObjTypeSpecFldIDL **)pWVar3;
    }
    codeGenData = (codeGenData->next).ptr;
    if (codeGenData == (FunctionCodeGenJitTimeData *)0x0) {
      return;
    }
    if ((isInlinee & 1U) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                         ,0xb2,"(isInlinee)","isInlinee");
      if (!bVar5) goto LAB_0043c144;
      *puVar11 = 0;
    }
    pFVar17 = (FunctionJITTimeDataIDL *)new<Memory::ArenaAllocator>(0xa8,alloc,0x36904a);
    jitData->next = pFVar17;
    isInlinee = true;
    jitData = pFVar17;
  }
  if ((isInlinee & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                       ,0x23,"(isInlinee)","isInlinee");
    if (!bVar5) {
LAB_0043c144:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar11 = 0;
  }
  return;
}

Assistant:

void
FunctionJITTimeInfo::BuildJITTimeData(
    __in ArenaAllocator * alloc,
    __in const Js::FunctionCodeGenJitTimeData * codeGenData,
    __in_opt const Js::FunctionCodeGenRuntimeData * runtimeData,
    __out FunctionJITTimeDataIDL * jitData,
    bool isInlinee,
    bool isForegroundJIT)
{
    jitData->functionInfoAddr = (intptr_t)codeGenData->GetFunctionInfo();
    jitData->localFuncId = codeGenData->GetFunctionInfo()->GetLocalFunctionId();
    jitData->isAggressiveInliningEnabled = codeGenData->GetIsAggressiveInliningEnabled();
    jitData->isInlined = codeGenData->GetIsInlined();
    jitData->weakFuncRef = (intptr_t)codeGenData->GetWeakFuncRef();
    jitData->inlineesBv = (BVFixedIDL*)(const BVFixed*)codeGenData->inlineesBv;
    jitData->entryPointInfoAddr = (intptr_t)codeGenData->GetEntryPointInfo();

    if (!codeGenData->GetFunctionBody() || !codeGenData->GetFunctionBody()->GetByteCode())
    {
        // outermost function must have a body, but inlinees may not (if they are builtins)
        Assert(isInlinee);
        return;
    }

    Js::FunctionBody * body = codeGenData->GetFunctionInfo()->GetParseableFunctionInfo()->GetFunctionBody();
    jitData->bodyData = AnewStructZ(alloc, FunctionBodyDataIDL);
    JITTimeFunctionBody::InitializeJITFunctionData(alloc, body, jitData->bodyData);

    Assert(isInlinee == !!runtimeData);
    const Js::FunctionCodeGenRuntimeData * targetRuntimeData = nullptr;
    if (runtimeData)
    {
        // may be polymorphic, so seek the runtime data matching our JIT time data
        targetRuntimeData = runtimeData->GetForTarget(codeGenData->GetFunctionInfo()->GetFunctionBody());
    }
    Js::FunctionBody * functionBody = codeGenData->GetFunctionBody();
    if (functionBody->HasDynamicProfileInfo())
    {
        ProfileDataIDL * profileData = AnewStruct(alloc, ProfileDataIDL);
        JITTimeProfileInfo::InitializeJITProfileData(alloc, functionBody->GetAnyDynamicProfileInfo(), functionBody, profileData, isForegroundJIT);

        jitData->bodyData->profileData = profileData;

        if (isInlinee)
        {
            // if not inlinee, NativeCodeGenerator will provide the address
            // REVIEW: OOP JIT, for inlinees, is this actually necessary?
            Js::ProxyEntryPointInfo *defaultEntryPointInfo = functionBody->GetDefaultEntryPointInfo();
            Assert(defaultEntryPointInfo->IsFunctionEntryPointInfo());
            Js::FunctionEntryPointInfo *functionEntryPointInfo = static_cast<Js::FunctionEntryPointInfo*>(defaultEntryPointInfo);
            jitData->callsCountAddress = (intptr_t)&functionEntryPointInfo->callsCount;

            jitData->sharedPropertyGuards = codeGenData->sharedPropertyGuards;
            jitData->sharedPropGuardCount = codeGenData->sharedPropertyGuardCount;
        }
    }
    if (jitData->bodyData->profiledCallSiteCount > 0)
    {
        jitData->inlineeCount = jitData->bodyData->profiledCallSiteCount;
        // using arena because we can't recycler allocate (may be on background), and heap freeing this is slightly complicated
        jitData->inlinees = AnewArrayZ(alloc, FunctionJITTimeDataIDL*, jitData->bodyData->profiledCallSiteCount);
        jitData->inlineesRecursionFlags = AnewArrayZ(alloc, boolean, jitData->bodyData->profiledCallSiteCount);

        for (Js::ProfileId i = 0; i < jitData->bodyData->profiledCallSiteCount; ++i)
        {
            const Js::FunctionCodeGenJitTimeData * inlineeJITData = codeGenData->GetInlinee(i);
            if (inlineeJITData == codeGenData)
            {
                jitData->inlineesRecursionFlags[i] = TRUE;
            }
            else if (inlineeJITData != nullptr)
            {
                const Js::FunctionCodeGenRuntimeData * inlineeRuntimeData = nullptr;
                if (inlineeJITData->GetFunctionInfo()->HasBody())
                {
                    inlineeRuntimeData = isInlinee ? targetRuntimeData->GetInlinee(i) : functionBody->GetInlineeCodeGenRuntimeData(i);
                }
                jitData->inlinees[i] = AnewStructZ(alloc, FunctionJITTimeDataIDL);
                BuildJITTimeData(alloc, inlineeJITData, inlineeRuntimeData, jitData->inlinees[i], true, isForegroundJIT);
            }
        }

        jitData->callbackInlinees = AnewArrayZ(alloc, FunctionJITTimeDataIDL*, jitData->bodyData->profiledCallSiteCount);

        for (Js::ProfileId i = 0; i < jitData->bodyData->profiledCallSiteCount; ++i)
        {
            const Js::FunctionCodeGenJitTimeData * inlineeJITData = codeGenData->GetCallbackInlinee(i);
            if (inlineeJITData != nullptr)
            {
                const Js::FunctionCodeGenRuntimeData * inlineeRuntimeData = nullptr;
                if (inlineeJITData->GetFunctionInfo()->HasBody())
                {
                    inlineeRuntimeData = isInlinee ? targetRuntimeData->GetCallbackInlinee(i) : functionBody->GetCallbackInlineeCodeGenRuntimeData(i);
                }
                jitData->callbackInlinees[i] = AnewStructZ(alloc, FunctionJITTimeDataIDL);
                BuildJITTimeData(alloc, inlineeJITData, inlineeRuntimeData, jitData->callbackInlinees[i], true, isForegroundJIT);
            }
        }

        jitData->callApplyTargetInlineeCount = jitData->bodyData->profiledCallApplyCallSiteCount;
        if (jitData->bodyData->profiledCallApplyCallSiteCount > 0)
        {
            jitData->callApplyTargetInlinees = AnewArrayZ(alloc, FunctionJITTimeDataIDL*, jitData->bodyData->profiledCallApplyCallSiteCount);
        }
        for (Js::ProfileId i = 0; i < jitData->bodyData->profiledCallApplyCallSiteCount; ++i)
        {
            const Js::FunctionCodeGenJitTimeData * inlineeJITData = codeGenData->GetCallApplyTargetInlinee(i);
            if (inlineeJITData != nullptr)
            {
                const Js::FunctionCodeGenRuntimeData * inlineeRuntimeData = nullptr;
                if (inlineeJITData->GetFunctionInfo()->HasBody())
                {
                    inlineeRuntimeData = isInlinee ? targetRuntimeData->GetCallApplyTargetInlinee(i) : functionBody->GetCallApplyTargetInlineeCodeGenRuntimeData(i);
                }
                jitData->callApplyTargetInlinees[i] = AnewStructZ(alloc, FunctionJITTimeDataIDL);
                BuildJITTimeData(alloc, inlineeJITData, inlineeRuntimeData, jitData->callApplyTargetInlinees[i], true, isForegroundJIT);
            }
        }
    }
    jitData->profiledRuntimeData = AnewStructZ(alloc, FunctionJITRuntimeIDL);
    if (isInlinee && targetRuntimeData->ClonedInlineCaches()->HasInlineCaches())
    {
        jitData->profiledRuntimeData->clonedCacheCount = jitData->bodyData->inlineCacheCount;
        jitData->profiledRuntimeData->clonedInlineCaches = AnewArray(alloc, intptr_t, jitData->profiledRuntimeData->clonedCacheCount);
        for (uint j = 0; j < jitData->bodyData->inlineCacheCount; ++j)
        {
            jitData->profiledRuntimeData->clonedInlineCaches[j] = (intptr_t)targetRuntimeData->ClonedInlineCaches()->GetInlineCache(j);
        }
    }
    if (jitData->bodyData->inlineCacheCount > 0)
    {
        jitData->ldFldInlineeCount = jitData->bodyData->inlineCacheCount;
        jitData->ldFldInlinees = AnewArrayZ(alloc, FunctionJITTimeDataIDL*, jitData->bodyData->inlineCacheCount);

        Field(ObjTypeSpecFldInfo*)* objTypeSpecInfo = codeGenData->GetObjTypeSpecFldInfoArray()->GetInfoArray();
        if(objTypeSpecInfo)
        {
            jitData->objTypeSpecFldInfoCount = jitData->bodyData->inlineCacheCount;
            jitData->objTypeSpecFldInfoArray = unsafe_write_barrier_cast<ObjTypeSpecFldIDL**>(objTypeSpecInfo);
        }
        for (Js::InlineCacheIndex i = 0; i < jitData->bodyData->inlineCacheCount; ++i)
        {
            const Js::FunctionCodeGenJitTimeData * inlineeJITData = codeGenData->GetLdFldInlinee(i);
            const Js::FunctionCodeGenRuntimeData * inlineeRuntimeData = isInlinee ? targetRuntimeData->GetLdFldInlinee(i) : functionBody->GetLdFldInlineeCodeGenRuntimeData(i);
            if (inlineeJITData != nullptr)
            {
                jitData->ldFldInlinees[i] = AnewStructZ(alloc, FunctionJITTimeDataIDL);
                BuildJITTimeData(alloc, inlineeJITData, inlineeRuntimeData, jitData->ldFldInlinees[i], true, isForegroundJIT);
            }
        }
    }
    if (!isInlinee && codeGenData->GetGlobalObjTypeSpecFldInfoCount() > 0)
    {
        Field(ObjTypeSpecFldInfo*)* globObjTypeSpecInfo = codeGenData->GetGlobalObjTypeSpecFldInfoArray();
        Assert(globObjTypeSpecInfo != nullptr);

        jitData->globalObjTypeSpecFldInfoCount = codeGenData->GetGlobalObjTypeSpecFldInfoCount();
        jitData->globalObjTypeSpecFldInfoArray = unsafe_write_barrier_cast<ObjTypeSpecFldIDL**>(globObjTypeSpecInfo);
    }
    const Js::FunctionCodeGenJitTimeData * nextJITData = codeGenData->GetNext();
    if (nextJITData != nullptr)
    {
        // only inlinee should be polymorphic
        Assert(isInlinee);
        jitData->next = AnewStructZ(alloc, FunctionJITTimeDataIDL);
        BuildJITTimeData(alloc, nextJITData, runtimeData, jitData->next, true, isForegroundJIT);
    }
}